

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
           *this,undefined8 *state,long *next)

{
  undefined8 *puVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  size_t count;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  char cVar13;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptr;
  long lVar14;
  long lVar15;
  node_base *pnVar16;
  long lVar17;
  byte bVar18;
  undefined8 *puVar19;
  long lVar20;
  nested_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *out;
  node_base *out_00;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  uVar3 = *state;
  count = state[2];
  lVar15 = state[0xb];
  local_58.
  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = (char *)state[3];
  local_58.
  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .matched = false;
  local_58.
  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._20_4_ = 0;
  local_58.begin_._M_current = (char *)state[3];
  local_58.zero_width_ = false;
  ptr = *(sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          **)(lVar15 + 0x18);
  local_58.
  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current =
       local_58.
       super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .first._M_current;
  if ((ulong)((*(long *)(lVar15 + 0x20) - (long)ptr >> 3) * -0x3333333333333333) < count) {
    ptr = sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::grow_((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(lVar15 + 8),count,&local_58);
  }
  else {
    *(sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      **)(lVar15 + 0x18) = ptr + count;
  }
  lVar20 = 0;
  for (lVar15 = *(long *)(state[7] + 0x70); lVar15 != state[7] + 0x68;
      lVar15 = *(long *)(lVar15 + 8)) {
    lVar20 = lVar20 + 1;
  }
  uVar4 = state[0xd];
  puVar19 = (undefined8 *)state[0xe];
  puVar1 = state + 0x10;
  uVar11 = *puVar1;
  uVar9 = *puVar1;
  uVar7 = *puVar1;
  puVar1 = state + 0x11;
  uVar12 = *puVar1;
  uVar10 = *puVar1;
  uVar8 = *puVar1;
  state[0xd] = 0;
  state[0xe] = state + 0xd;
  if (0 < (long)state[2]) {
    lVar15 = state[1];
    lVar14 = state[2] + 1;
    lVar17 = 0;
    do {
      *(undefined8 *)
       ((long)&(ptr->
               super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .first._M_current + lVar17) = *(undefined8 *)(lVar15 + lVar17);
      *(undefined8 *)
       ((long)&(ptr->
               super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .second._M_current + lVar17) = *(undefined8 *)(lVar15 + 8 + lVar17);
      (&(ptr->
        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).matched)[lVar17] = *(bool *)(lVar15 + 0x10 + lVar17);
      uVar5 = *(undefined8 *)(lVar15 + 0x19 + lVar17);
      *(undefined8 *)
       (&(ptr->
         super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).field_0x14 + lVar17) = *(undefined8 *)(lVar15 + 0x14 + lVar17);
      *(undefined8 *)((long)&(ptr->begin_)._M_current + lVar17 + 1) = uVar5;
      lVar14 = lVar14 + -1;
      lVar17 = lVar17 + 0x28;
    } while (1 < lVar14);
  }
  puVar1 = state + 0x10;
  if (this[8] ==
      (lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
       )0x1) {
    uVar2 = *(undefined1 *)((long)state + 0x31);
    cVar13 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
    state[0xd] = uVar4;
    state[0xe] = puVar19;
    *puVar19 = 0;
    if (cVar13 == '\0') {
      cVar13 = (**(code **)(*next + 0x10))(next,state);
      lVar15 = *(long *)(state[7] + 0x70);
      lVar14 = state[7] + 0x68;
      if (cVar13 != '\0') {
        lVar17 = 0;
        for (; lVar15 != lVar14; lVar15 = *(long *)(lVar15 + 8)) {
          lVar17 = lVar17 + 1;
        }
        puVar19 = (undefined8 *)0x1;
        if (lVar17 == lVar20) {
          sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(state[0xb] + 8),ptr);
        }
        goto LAB_00137fea;
      }
      lVar17 = 0;
      for (; lVar15 != lVar14; lVar15 = *(long *)(lVar15 + 8)) {
        lVar17 = lVar17 + 1;
      }
      if (lVar17 == lVar20) {
        sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(state[0xb] + 8),ptr);
      }
      *puVar1 = uVar11;
      state[0x11] = uVar12;
      bVar6 = true;
    }
    else {
      out = (nested_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(state[7] + 0x68);
      lVar15 = 0;
      for (pnVar16 = *(node_base **)(state[7] + 0x70); pnVar16 != (node_base *)out;
          pnVar16 = pnVar16->_next) {
        lVar15 = lVar15 + 1;
      }
      if (lVar15 != lVar20) {
        lVar14 = state[0xb];
        lVar20 = lVar20 - lVar15;
        do {
          results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reclaim_last((results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(lVar14 + 0x28),out);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0);
      }
      if (0 < (long)state[2]) {
        lVar15 = state[1];
        lVar20 = state[2] + 1;
        lVar14 = 0;
        do {
          *(undefined8 *)(lVar15 + lVar14) =
               *(undefined8 *)
                ((long)&(ptr->
                        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .first._M_current + lVar14);
          *(undefined8 *)(lVar15 + 8 + lVar14) =
               *(undefined8 *)
                ((long)&(ptr->
                        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .second._M_current + lVar14);
          *(bool *)(lVar15 + 0x10 + lVar14) =
               (&(ptr->
                 super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).matched)[lVar14];
          uVar4 = *(undefined8 *)((long)&(ptr->begin_)._M_current + lVar14 + 1);
          *(undefined8 *)(lVar15 + 0x14 + lVar14) =
               *(undefined8 *)
                (&(ptr->
                  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).field_0x14 + lVar14);
          *(undefined8 *)(lVar15 + 0x19 + lVar14) = uVar4;
          lVar20 = lVar20 + -1;
          lVar14 = lVar14 + 0x28;
        } while (1 < lVar20);
      }
      sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(state[0xb] + 8),ptr);
      *puVar1 = uVar7;
      state[0x11] = uVar8;
      *state = uVar3;
      puVar19 = (undefined8 *)0x0;
LAB_00137fea:
      bVar6 = false;
    }
    bVar18 = (byte)puVar19;
    *(undefined1 *)((long)state + 0x31) = uVar2;
    if (!bVar6) goto LAB_0013801f;
  }
  else {
    cVar13 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
    if (cVar13 == '\0') {
      state[0xd] = uVar4;
      state[0xe] = puVar19;
      *puVar19 = 0;
      lVar14 = 0;
      for (lVar15 = *(long *)(state[7] + 0x70); lVar15 != state[7] + 0x68;
          lVar15 = *(long *)(lVar15 + 8)) {
        lVar14 = lVar14 + 1;
      }
      if (lVar14 == lVar20) goto LAB_00137fa3;
    }
    else {
      *state = uVar3;
      state[0xd] = uVar4;
      state[0xe] = puVar19;
      *puVar19 = 0;
      cVar13 = (**(code **)(*next + 0x10))(next,state);
      pnVar16 = *(node_base **)(state[7] + 0x70);
      out_00 = (node_base *)(state[7] + 0x68);
      if (cVar13 != '\0') {
        lVar15 = 0;
        for (; pnVar16 != out_00; pnVar16 = pnVar16->_next) {
          lVar15 = lVar15 + 1;
        }
        bVar18 = 1;
        if (lVar15 == lVar20) {
          sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(state[0xb] + 8),ptr);
        }
        goto LAB_0013801f;
      }
      lVar15 = 0;
      for (; pnVar16 != out_00; pnVar16 = pnVar16->_next) {
        lVar15 = lVar15 + 1;
      }
      if (lVar15 != lVar20) {
        lVar14 = state[0xb];
        lVar20 = lVar20 - lVar15;
        do {
          results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reclaim_last((results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(lVar14 + 0x28),
                         (nested_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)out_00);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0);
      }
      if (0 < (long)state[2]) {
        lVar15 = state[1];
        lVar20 = state[2] + 1;
        lVar14 = 0;
        do {
          *(undefined8 *)(lVar15 + lVar14) =
               *(undefined8 *)
                ((long)&(ptr->
                        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .first._M_current + lVar14);
          *(undefined8 *)(lVar15 + 8 + lVar14) =
               *(undefined8 *)
                ((long)&(ptr->
                        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .second._M_current + lVar14);
          *(bool *)(lVar15 + 0x10 + lVar14) =
               (&(ptr->
                 super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).matched)[lVar14];
          uVar3 = *(undefined8 *)((long)&(ptr->begin_)._M_current + lVar14 + 1);
          *(undefined8 *)(lVar15 + 0x14 + lVar14) =
               *(undefined8 *)
                (&(ptr->
                  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).field_0x14 + lVar14);
          *(undefined8 *)(lVar15 + 0x19 + lVar14) = uVar3;
          lVar20 = lVar20 + -1;
          lVar14 = lVar14 + 0x28;
        } while (1 < lVar20);
      }
LAB_00137fa3:
      sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(state[0xb] + 8),ptr);
    }
    *puVar1 = uVar9;
    state[0x11] = uVar10;
  }
  bVar18 = 0;
LAB_0013801f:
  return (bool)(bVar18 & 1);
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::false_) const
        {
            BidiIter const tmp = state.cur_;

            // matching xpr could produce side-effects, save state
            memento<BidiIter> mem = save_sub_matches(state);

            if(this->not_)
            {
                // negative look-ahead assertions do not trigger partial matches.
                save_restore<bool> partial_match(state.found_partial_match_);
                detail::ignore_unused(partial_match);

                if(this->xpr_.match(state))
                {
                    restore_action_queue(mem, state);
                    restore_sub_matches(mem, state);
                    state.cur_ = tmp;
                    return false;
                }
                restore_action_queue(mem, state);
                if(next.match(state))
                {
                    reclaim_sub_matches(mem, state, true);
                    return true;
                }
                reclaim_sub_matches(mem, state, false);
            }
            else
            {
                if(!this->xpr_.match(state))
                {
                    restore_action_queue(mem, state);
                    reclaim_sub_matches(mem, state, false);
                    return false;
                }
                state.cur_ = tmp;
                restore_action_queue(mem, state);
                if(next.match(state))
                {
                    reclaim_sub_matches(mem, state, true);
                    return true;
                }
                restore_sub_matches(mem, state);
            }

            BOOST_ASSERT(state.cur_ == tmp);
            return false;
        }